

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha512_Update(SHA512_CTX *context,sha2_byte *data,size_t len)

{
  uint64_t *puVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [11];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint uVar42;
  ulong uVar43;
  long lVar44;
  void *__dest;
  ulong uVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [11];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [11];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar49 [15];
  undefined1 auVar53 [15];
  
  if (len == 0) {
    return;
  }
  uVar42 = (uint)context->bitcount[0] >> 3 & 0x7f;
  if (uVar42 != 0) {
    uVar45 = (ulong)(0x80 - uVar42);
    __dest = (void *)((long)context->buffer + (ulong)uVar42);
    if (len < uVar45) {
      memcpy(__dest,data,len);
      puVar1 = context->bitcount;
      bVar46 = CARRY8(*puVar1,len * 8);
      *puVar1 = *puVar1 + len * 8;
      goto joined_r0x0012b9d6;
    }
    memcpy(__dest,data,uVar45);
    uVar43 = (ulong)((0x80 - uVar42) * 8);
    puVar1 = context->bitcount;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar43;
    if (CARRY8(uVar2,uVar43)) {
      context->bitcount[1] = context->bitcount[1] + 1;
    }
    lVar44 = 10;
    do {
      auVar50 = *(undefined1 (*) [16])(context->state + lVar44);
      auVar55[8] = auVar50[8];
      auVar55[9] = 0;
      auVar55[10] = auVar50[9];
      auVar52._0_10_ = (unkuint10)auVar50[0xc] << 0x40;
      auVar52[10] = auVar50[0xd];
      auVar53[0xb] = 0;
      auVar53._0_11_ = auVar52;
      auVar53[0xc] = auVar50[0xe];
      auVar53[0xd] = 0;
      auVar53[0xe] = auVar50[0xf];
      auVar55[3] = 0;
      auVar55._0_3_ = auVar52._8_3_;
      auVar55._4_3_ = auVar53._12_3_;
      auVar55[7] = 0;
      auVar55[0xb] = 0;
      auVar55._12_3_ = (int3)(CONCAT16(auVar50[0xb],(uint6)auVar50[10] << 0x20) >> 0x20);
      auVar55[0xf] = 0;
      auVar54 = pshuflw(auVar55,auVar55,0x1b);
      auVar55 = pshufhw(auVar54,auVar54,0x1b);
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar50._0_13_;
      auVar19[0xe] = auVar50[7];
      auVar20[0xc] = auVar50[6];
      auVar20._0_12_ = auVar50._0_12_;
      auVar20._13_2_ = auVar19._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar50._0_11_;
      auVar22._12_3_ = auVar20._12_3_;
      auVar24[10] = auVar50[5];
      auVar24._0_10_ = auVar50._0_10_;
      auVar24._11_4_ = auVar22._11_4_;
      auVar26[9] = 0;
      auVar26._0_9_ = auVar50._0_9_;
      auVar26._10_5_ = auVar24._10_5_;
      auVar28[8] = auVar50[4];
      auVar28._0_8_ = auVar50._0_8_;
      auVar28._9_6_ = auVar26._9_6_;
      auVar54[7] = 0;
      auVar54._0_7_ = auVar28._8_7_;
      auVar34._7_8_ = 0;
      auVar34._0_7_ = auVar28._8_7_;
      auVar38._1_8_ = SUB158(auVar34 << 0x40,7);
      auVar38[0] = auVar50[3];
      auVar38._9_6_ = 0;
      auVar35._1_10_ = SUB1510(auVar38 << 0x30,5);
      auVar35[0] = auVar50[2];
      auVar39._11_4_ = 0;
      auVar39._0_11_ = auVar35;
      auVar31[2] = auVar50[1];
      auVar31._0_2_ = auVar50._0_2_;
      auVar31._3_12_ = SUB1512(auVar39 << 0x20,3);
      auVar32._2_13_ = auVar31._2_13_;
      auVar32._0_2_ = auVar50._0_2_ & 0xff;
      auVar54._8_4_ = auVar32._0_4_;
      auVar54._12_4_ = auVar35._0_4_;
      auVar50 = pshuflw(auVar54,auVar54,0x1b);
      auVar50 = pshufhw(auVar50,auVar50,0x1b);
      sVar3 = auVar50._0_2_;
      sVar4 = auVar50._2_2_;
      sVar5 = auVar50._4_2_;
      sVar6 = auVar50._6_2_;
      sVar7 = auVar50._8_2_;
      sVar8 = auVar50._10_2_;
      sVar9 = auVar50._12_2_;
      sVar10 = auVar50._14_2_;
      sVar11 = auVar55._0_2_;
      sVar12 = auVar55._2_2_;
      sVar13 = auVar55._4_2_;
      sVar14 = auVar55._6_2_;
      sVar15 = auVar55._8_2_;
      sVar16 = auVar55._10_2_;
      sVar17 = auVar55._12_2_;
      sVar18 = auVar55._14_2_;
      puVar1 = context->state + lVar44;
      *(char *)puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar50[0] - (0xff < sVar3);
      *(char *)((long)puVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar50[2] - (0xff < sVar4);
      *(char *)((long)puVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar50[4] - (0xff < sVar5);
      *(char *)((long)puVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar50[6] - (0xff < sVar6);
      *(char *)((long)puVar1 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar50[8] - (0xff < sVar7);
      *(char *)((long)puVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar50[10] - (0xff < sVar8);
      *(char *)((long)puVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xc] - (0xff < sVar9);
      *(char *)((long)puVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar50[0xe] - (0xff < sVar10)
      ;
      *(char *)(puVar1 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar55[0] - (0xff < sVar11);
      *(char *)((long)puVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar55[2] - (0xff < sVar12);
      *(char *)((long)puVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar55[4] - (0xff < sVar13);
      *(char *)((long)puVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar55[6] - (0xff < sVar14)
      ;
      *(char *)((long)puVar1 + 0xc) = (0 < sVar15) * (sVar15 < 0x100) * auVar55[8] - (0xff < sVar15)
      ;
      *(char *)((long)puVar1 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar55[10] - (0xff < sVar16);
      *(char *)((long)puVar1 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar55[0xc] - (0xff < sVar17);
      *(char *)((long)puVar1 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xe] - (0xff < sVar18);
      lVar44 = lVar44 + 2;
    } while (lVar44 != 0x1a);
    data = data + uVar45;
    sha512_Transform(context->state,context->buffer,context->state);
    len = len - uVar45;
  }
  if (0x7f < len) {
    do {
      memcpy(context->buffer,data,0x80);
      lVar44 = 10;
      do {
        auVar50 = *(undefined1 (*) [16])(context->state + lVar44);
        auVar51[8] = auVar50[8];
        auVar51[9] = 0;
        auVar51[10] = auVar50[9];
        auVar48._0_10_ = (unkuint10)auVar50[0xc] << 0x40;
        auVar48[10] = auVar50[0xd];
        auVar49[0xb] = 0;
        auVar49._0_11_ = auVar48;
        auVar49[0xc] = auVar50[0xe];
        auVar49[0xd] = 0;
        auVar49[0xe] = auVar50[0xf];
        auVar51[3] = 0;
        auVar51._0_3_ = auVar48._8_3_;
        auVar51._4_3_ = auVar49._12_3_;
        auVar51[7] = 0;
        auVar51[0xb] = 0;
        auVar51._12_3_ = (int3)(CONCAT16(auVar50[0xb],(uint6)auVar50[10] << 0x20) >> 0x20);
        auVar51[0xf] = 0;
        auVar54 = pshuflw(auVar51,auVar51,0x1b);
        auVar54 = pshufhw(auVar54,auVar54,0x1b);
        auVar21[0xd] = 0;
        auVar21._0_13_ = auVar50._0_13_;
        auVar21[0xe] = auVar50[7];
        auVar23[0xc] = auVar50[6];
        auVar23._0_12_ = auVar50._0_12_;
        auVar23._13_2_ = auVar21._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar50._0_11_;
        auVar25._12_3_ = auVar23._12_3_;
        auVar27[10] = auVar50[5];
        auVar27._0_10_ = auVar50._0_10_;
        auVar27._11_4_ = auVar25._11_4_;
        auVar29[9] = 0;
        auVar29._0_9_ = auVar50._0_9_;
        auVar29._10_5_ = auVar27._10_5_;
        auVar30[8] = auVar50[4];
        auVar30._0_8_ = auVar50._0_8_;
        auVar30._9_6_ = auVar29._9_6_;
        auVar47[7] = 0;
        auVar47._0_7_ = auVar30._8_7_;
        auVar36._7_8_ = 0;
        auVar36._0_7_ = auVar30._8_7_;
        auVar40._1_8_ = SUB158(auVar36 << 0x40,7);
        auVar40[0] = auVar50[3];
        auVar40._9_6_ = 0;
        auVar37._1_10_ = SUB1510(auVar40 << 0x30,5);
        auVar37[0] = auVar50[2];
        auVar41._11_4_ = 0;
        auVar41._0_11_ = auVar37;
        auVar33._3_12_ = SUB1512(auVar41 << 0x20,3);
        auVar33[2] = auVar50[1];
        auVar33[1] = 0;
        auVar33[0] = auVar50[0];
        auVar47._8_4_ = auVar33._0_4_;
        auVar47._12_4_ = auVar37._0_4_;
        auVar50 = pshuflw(auVar47,auVar47,0x1b);
        auVar50 = pshufhw(auVar50,auVar50,0x1b);
        sVar3 = auVar50._0_2_;
        sVar4 = auVar50._2_2_;
        sVar5 = auVar50._4_2_;
        sVar6 = auVar50._6_2_;
        sVar7 = auVar50._8_2_;
        sVar8 = auVar50._10_2_;
        sVar9 = auVar50._12_2_;
        sVar10 = auVar50._14_2_;
        sVar11 = auVar54._0_2_;
        sVar12 = auVar54._2_2_;
        sVar13 = auVar54._4_2_;
        sVar14 = auVar54._6_2_;
        sVar15 = auVar54._8_2_;
        sVar16 = auVar54._10_2_;
        sVar17 = auVar54._12_2_;
        sVar18 = auVar54._14_2_;
        puVar1 = context->state + lVar44;
        *(char *)puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar50[0] - (0xff < sVar3);
        *(char *)((long)puVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar50[2] - (0xff < sVar4);
        *(char *)((long)puVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar50[4] - (0xff < sVar5);
        *(char *)((long)puVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar50[6] - (0xff < sVar6);
        *(char *)((long)puVar1 + 4) = (0 < sVar7) * (sVar7 < 0x100) * auVar50[8] - (0xff < sVar7);
        *(char *)((long)puVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar50[10] - (0xff < sVar8);
        *(char *)((long)puVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar50[0xc] - (0xff < sVar9);
        *(char *)((long)puVar1 + 7) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar50[0xe] - (0xff < sVar10);
        *(char *)(puVar1 + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar54[0] - (0xff < sVar11);
        *(char *)((long)puVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar54[2] - (0xff < sVar12)
        ;
        *(char *)((long)puVar1 + 10) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar54[4] - (0xff < sVar13);
        *(char *)((long)puVar1 + 0xb) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar54[6] - (0xff < sVar14);
        *(char *)((long)puVar1 + 0xc) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar54[8] - (0xff < sVar15);
        *(char *)((long)puVar1 + 0xd) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar54[10] - (0xff < sVar16);
        *(char *)((long)puVar1 + 0xe) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar54[0xc] - (0xff < sVar17);
        *(char *)((long)puVar1 + 0xf) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar54[0xe] - (0xff < sVar18);
        lVar44 = lVar44 + 2;
      } while (lVar44 != 0x1a);
      sha512_Transform(context->state,context->buffer,context->state);
      uVar45 = context->bitcount[0];
      context->bitcount[0] = uVar45 + 0x400;
      if (0xfffffffffffffbff < uVar45) {
        context->bitcount[1] = context->bitcount[1] + 1;
      }
      len = len - 0x80;
      data = data + 0x80;
    } while (0x7f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy(context->buffer,data,len);
  puVar1 = context->bitcount;
  bVar46 = CARRY8(*puVar1,len * 8);
  *puVar1 = *puVar1 + len * 8;
joined_r0x0012b9d6:
  if (bVar46) {
    context->bitcount[1] = context->bitcount[1] + 1;
  }
  return;
}

Assistant:

void sha512_Update(trezor::SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE64(context->buffer[j],context->buffer[j]);
			}
#endif
			sha512_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			ADDINC128(context->bitcount, len << 3);
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA512_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE64(context->buffer[j],context->buffer[j]);
		}
#endif
		sha512_Transform(context->state, context->buffer, context->state);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}